

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_23::BinaryReader::ReadSections(BinaryReader *this)

{
  BinarySection sec;
  bool bVar1;
  BinarySectionOrder BVar2;
  BinarySectionOrder BVar3;
  Result RVar4;
  char *pcVar5;
  Result local_e4;
  Enum local_e0;
  Enum local_dc;
  Enum local_d8;
  Enum local_d4;
  Enum local_d0;
  Enum local_cc;
  Enum local_c8;
  Enum local_c4;
  Enum local_c0;
  Enum local_bc;
  Enum local_b8;
  Enum local_b4;
  Enum local_b0;
  Enum local_ac;
  Enum local_a8;
  Enum local_a4;
  Enum local_a0;
  Enum local_9c;
  Enum local_98;
  Enum local_94;
  Enum local_90;
  Enum local_8c;
  Enum local_88;
  Enum local_84;
  Enum local_80;
  Enum local_7c;
  Enum local_78;
  Enum local_74;
  Enum local_70;
  Result local_6c;
  byte local_65;
  Result section_result;
  bool stop_on_first_error;
  BinarySection section;
  ReadEndRestoreGuard guard;
  Offset local_40;
  Offset section_size;
  byte local_2e [2];
  uint32_t section_code;
  bool seen_section_code [14];
  Index section_index;
  Result result;
  BinaryReader *this_local;
  
  Result::Result((Result *)(seen_section_code + 10),Ok);
  seen_section_code[6] = false;
  seen_section_code[7] = false;
  seen_section_code[8] = false;
  seen_section_code[9] = false;
  memset(local_2e,0,0xe);
  do {
    if ((this->state_).size <= (this->state_).offset) {
      RVar4.enum_._0_1_ = seen_section_code[10];
      RVar4.enum_._1_1_ = seen_section_code[0xb];
      RVar4.enum_._2_1_ = seen_section_code[0xc];
      RVar4.enum_._3_1_ = seen_section_code[0xd];
      return (Result)RVar4.enum_;
    }
    guard.previous_value_._4_4_ =
         ReadU32Leb128(this,(uint32_t *)((long)&section_size + 4),"section code");
    bVar1 = Failed(guard.previous_value_._4_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    guard.previous_value_._0_4_ = ReadOffset(this,&local_40,"section size");
    bVar1 = Failed(guard.previous_value_._0_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
    ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                       *)&section,this);
    sec = section_size._4_4_;
    this->read_end_ = (this->state_).offset + local_40;
    if ((uint)section_size._4_4_ < 0xe) {
      if (section_size._4_4_ != Custom) {
        if ((local_2e[(uint)section_size._4_4_] & 1) != 0) {
          pcVar5 = GetSectionName(section_size._4_4_);
          PrintError(this,"multiple %s sections",pcVar5);
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
          goto LAB_0014dda5;
        }
        local_2e[(uint)section_size._4_4_] = 1;
      }
      if ((this->state_).size < this->read_end_) {
        PrintError(this,"invalid section size: extends past end");
        Result::Result((Result *)((long)&this_local + 4),Error);
        bVar1 = true;
      }
      else {
        if ((this->last_known_section_ != Invalid) && (section_size._4_4_ != Custom)) {
          BVar2 = GetSectionOrder(section_size._4_4_);
          BVar3 = GetSectionOrder(this->last_known_section_);
          if ((int)BVar2 <= (int)BVar3) {
            pcVar5 = GetSectionName(sec);
            PrintError(this,"section %s out of order",pcVar5);
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
            goto LAB_0014dda5;
          }
        }
        if (((this->did_read_names_section_ & 1U) == 0) || (sec == Custom)) {
          section_result.enum_ =
               (*this->delegate_->_vptr_BinaryReaderDelegate[6])
                         (this->delegate_,(ulong)(uint)seen_section_code._6_4_,(ulong)(uint)sec,
                          local_40);
          bVar1 = Succeeded(section_result);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_65 = this->options_->stop_on_first_error & 1;
            Result::Result(&local_6c,Error);
            switch(sec) {
            case Custom:
              local_70 = (Enum)ReadCustomSection(this,local_40);
              local_6c = (Result)local_70;
              if ((this->options_->fail_on_custom_section_error & 1U) == 0) {
                local_65 = 0;
              }
              else {
                local_74 = local_70;
                Result::operator|=((Result *)(seen_section_code + 10),(Result)local_70);
              }
              break;
            case Type:
              local_7c = (Enum)ReadTypeSection(this,local_40);
              local_78 = local_7c;
              local_6c = (Result)local_7c;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_7c);
              break;
            case Import:
              local_84 = (Enum)ReadImportSection(this,local_40);
              local_80 = local_84;
              local_6c = (Result)local_84;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_84);
              break;
            case Function:
              local_8c = (Enum)ReadFunctionSection(this,local_40);
              local_88 = local_8c;
              local_6c = (Result)local_8c;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_8c);
              break;
            case Table:
              local_94 = (Enum)ReadTableSection(this,local_40);
              local_90 = local_94;
              local_6c = (Result)local_94;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_94);
              break;
            case Memory:
              local_9c = (Enum)ReadMemorySection(this,local_40);
              local_98 = local_9c;
              local_6c = (Result)local_9c;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_9c);
              break;
            case Global:
              local_a4 = (Enum)ReadGlobalSection(this,local_40);
              local_a0 = local_a4;
              local_6c = (Result)local_a4;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_a4);
              break;
            case Export:
              local_ac = (Enum)ReadExportSection(this,local_40);
              local_a8 = local_ac;
              local_6c = (Result)local_ac;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_ac);
              break;
            case Start:
              local_b4 = (Enum)ReadStartSection(this,local_40);
              local_b0 = local_b4;
              local_6c = (Result)local_b4;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_b4);
              break;
            case Elem:
              local_bc = (Enum)ReadElemSection(this,local_40);
              local_b8 = local_bc;
              local_6c = (Result)local_bc;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_bc);
              break;
            case Code:
              local_c4 = (Enum)ReadCodeSection(this,local_40);
              local_c0 = local_c4;
              local_6c = (Result)local_c4;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_c4);
              break;
            case Data:
              local_cc = (Enum)ReadDataSection(this,local_40);
              local_c8 = local_cc;
              local_6c = (Result)local_cc;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_cc);
              break;
            case DataCount:
              bVar1 = Features::bulk_memory_enabled(&this->options_->features);
              if (!bVar1) {
                PrintError(this,"invalid section code: %u",(ulong)(uint)sec);
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
                goto LAB_0014dda5;
              }
              local_dc = (Enum)ReadDataCountSection(this,local_40);
              local_d8 = local_dc;
              local_6c = (Result)local_dc;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_dc);
              break;
            case Event:
              bVar1 = Features::exceptions_enabled(&this->options_->features);
              if (!bVar1) {
                PrintError(this,"invalid section code: %u",(ulong)(uint)sec);
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
                goto LAB_0014dda5;
              }
              local_d4 = (Enum)ReadEventSection(this,local_40);
              local_d0 = local_d4;
              local_6c = (Result)local_d4;
              Result::operator|=((Result *)(seen_section_code + 10),(Result)local_d4);
              break;
            case Invalid:
              abort();
            }
            local_e0 = local_6c.enum_;
            bVar1 = Succeeded(local_6c);
            if ((bVar1) && ((this->state_).offset != this->read_end_)) {
              PrintError(this,"unfinished section (expected end: 0x%zx)",this->read_end_);
              Result::Result(&local_e4,Error);
              local_6c.enum_ = local_e4.enum_;
              Result::operator|=((Result *)(seen_section_code + 10),local_e4);
            }
            bVar1 = Failed(local_6c);
            if (bVar1) {
              if ((local_65 & 1) != 0) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
                goto LAB_0014dda5;
              }
              (this->state_).offset = this->read_end_;
            }
            if (sec != Custom) {
              this->last_known_section_ = sec;
            }
            bVar1 = false;
          }
          else {
            PrintError(this,"BeginSection callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
        }
        else {
          pcVar5 = GetSectionName(sec);
          PrintError(this,"%s section can not occur after Name section",pcVar5);
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
      }
    }
    else {
      PrintError(this,"invalid section code: %u",(ulong)(uint)section_size._4_4_);
      Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
LAB_0014dda5:
    ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
    ~ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                        *)&section);
    if (bVar1) {
      return (Result)this_local._4_4_;
    }
    seen_section_code._6_4_ = seen_section_code._6_4_ + 1;
  } while( true );
}

Assistant:

Result BinaryReader::ReadSections() {
  Result result = Result::Ok;
  Index section_index = 0;
  bool seen_section_code[static_cast<int>(BinarySection::Last) + 1] = {false};

  for (; state_.offset < state_.size; ++section_index) {
    uint32_t section_code;
    Offset section_size;
    CHECK_RESULT(ReadU32Leb128(&section_code, "section code"));
    CHECK_RESULT(ReadOffset(&section_size, "section size"));
    ReadEndRestoreGuard guard(this);
    read_end_ = state_.offset + section_size;
    if (section_code >= kBinarySectionCount) {
      PrintError("invalid section code: %u", section_code);
      return Result::Error;
    }

    BinarySection section = static_cast<BinarySection>(section_code);
    if (section != BinarySection::Custom) {
      if (seen_section_code[section_code]) {
        PrintError("multiple %s sections", GetSectionName(section));
        return Result::Error;
      }
      seen_section_code[section_code] = true;
    }

    ERROR_UNLESS(read_end_ <= state_.size,
                 "invalid section size: extends past end");

    ERROR_UNLESS(
        last_known_section_ == BinarySection::Invalid ||
            section == BinarySection::Custom ||
            GetSectionOrder(section) > GetSectionOrder(last_known_section_),
        "section %s out of order", GetSectionName(section));

    ERROR_UNLESS(!did_read_names_section_ || section == BinarySection::Custom,
                 "%s section can not occur after Name section",
                 GetSectionName(section));

    CALLBACK(BeginSection, section_index, section, section_size);

    bool stop_on_first_error = options_.stop_on_first_error;
    Result section_result = Result::Error;
    switch (section) {
      case BinarySection::Custom:
        section_result = ReadCustomSection(section_size);
        if (options_.fail_on_custom_section_error) {
          result |= section_result;
        } else {
          stop_on_first_error = false;
        }
        break;
      case BinarySection::Type:
        section_result = ReadTypeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Import:
        section_result = ReadImportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Function:
        section_result = ReadFunctionSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Table:
        section_result = ReadTableSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Memory:
        section_result = ReadMemorySection(section_size);
        result |= section_result;
        break;
      case BinarySection::Global:
        section_result = ReadGlobalSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Export:
        section_result = ReadExportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Start:
        section_result = ReadStartSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Elem:
        section_result = ReadElemSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Code:
        section_result = ReadCodeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Data:
        section_result = ReadDataSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Event:
        ERROR_UNLESS(options_.features.exceptions_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadEventSection(section_size);
        result |= section_result;
        break;
      case BinarySection::DataCount:
        ERROR_UNLESS(options_.features.bulk_memory_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadDataCountSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Invalid:
        WABT_UNREACHABLE;
    }

    if (Succeeded(section_result) && state_.offset != read_end_) {
      PrintError("unfinished section (expected end: 0x%" PRIzx ")", read_end_);
      section_result = Result::Error;
      result |= section_result;
    }

    if (Failed(section_result)) {
      if (stop_on_first_error) {
        return Result::Error;
      }

      // If we're continuing after failing to read this section, move the
      // offset to the expected section end. This way we may be able to read
      // further sections.
      state_.offset = read_end_;
    }


    if (section != BinarySection::Custom) {
      last_known_section_ = section;
    }
  }

  return result;
}